

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9.cpp
# Opt level: O2

Stream * rw::d3d9::writeNativeData
                   (Stream *stream,int32 len,void *object,int32 param_4,int32 param_5)

{
  long lVar1;
  void *vertexBuffer;
  int32 iVar2;
  uint32 val;
  undefined4 uVar3;
  undefined4 *puVar4;
  uint16 *puVar5;
  uint8 *puVar6;
  undefined4 *puVar7;
  long lVar8;
  undefined4 *puVar9;
  uint32 i;
  uint uVar10;
  VertexElement elements [12];
  
  writeChunkHeader(stream,1,len + -0xc);
  if ((*(int **)((long)object + 0x98) != (int *)0x0) && (**(int **)((long)object + 0x98) == 9)) {
    Stream::writeU32(stream,9);
    lVar1 = *(long *)((long)object + 0x98);
    lVar8 = (ulong)*(ushort *)(*(long *)((long)object + 0x90) + 4) * 0x24 + 0x40;
    allocLocation =
         "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/d3d9.cpp line: 254"
    ;
    puVar4 = (undefined4 *)(*DAT_00144da8)(lVar8,0x1000f);
    Stream::writeI32(stream,(int32)lVar8);
    *puVar4 = *(undefined4 *)(lVar1 + 4);
    puVar4[1] = *(undefined4 *)(lVar1 + 8);
    puVar4[3] = *(undefined4 *)(lVar1 + 0x18);
    puVar4[0xc] = *(undefined4 *)(lVar1 + 0x50);
    puVar4[0xe] = *(undefined4 *)(lVar1 + 0x60);
    puVar4[0xf] = *(undefined4 *)(lVar1 + 100);
    puVar7 = puVar4 + 0x10;
    puVar9 = *(undefined4 **)(lVar1 + 0x68);
    for (uVar10 = 0; uVar10 < *(uint *)(lVar1 + 8); uVar10 = uVar10 + 1) {
      *puVar7 = *puVar9;
      puVar7[1] = puVar9[1];
      iVar2 = MaterialList::findIndex
                        ((MaterialList *)((long)object + 0x80),*(Material **)(puVar9 + 2));
      puVar7[2] = iVar2;
      puVar7[3] = puVar9[4];
      puVar7[4] = 0;
      puVar7[5] = puVar9[8];
      puVar7[6] = puVar9[9];
      puVar7[7] = puVar9[10];
      puVar7[8] = puVar9[0xb];
      puVar7 = puVar7 + 9;
      puVar9 = puVar9 + 0xc;
    }
    (*stream->_vptr_Stream[3])(stream,puVar4,lVar8);
    val = getDeclaration(*(void **)(lVar1 + 0x58),elements);
    Stream::writeU32(stream,val);
    (*stream->_vptr_Stream[3])(stream,elements,(ulong)(val << 3));
    puVar5 = d3d::lockIndices(*(void **)(lVar1 + 0x10),0,0,0);
    (*stream->_vptr_Stream[3])(stream,puVar5,(ulong)(uint)(*(int *)(lVar1 + 0x60) * 2));
    d3d::unlockIndices(*(void **)(lVar1 + 0x10));
    for (lVar8 = 0; lVar8 != 0x30; lVar8 = lVar8 + 0x18) {
      uVar3 = 0xbadeaffe;
      if (*(long *)(lVar1 + 0x20 + lVar8) == 0) {
        uVar3 = 0;
      }
      *puVar4 = uVar3;
      puVar4[1] = *(undefined4 *)(lVar1 + 0x28 + lVar8);
      puVar4[2] = *(undefined4 *)(lVar1 + 0x2c + lVar8);
      *(undefined2 *)(puVar4 + 3) = *(undefined2 *)(lVar1 + 0x30 + lVar8);
      *(undefined1 *)((long)puVar4 + 0xe) = *(undefined1 *)(lVar1 + 0x32 + lVar8);
      *(undefined1 *)((long)puVar4 + 0xf) = *(undefined1 *)(lVar1 + 0x33 + lVar8);
      (*stream->_vptr_Stream[3])(stream,puVar4,0x10);
      vertexBuffer = *(void **)(lVar1 + 0x20 + lVar8);
      if (vertexBuffer != (void *)0x0) {
        puVar6 = d3d::lockVertices(vertexBuffer,0,0,0);
        (*stream->_vptr_Stream[3])
                  (stream,puVar6,
                   (ulong)(uint)(*(int *)(lVar1 + 100) * *(int *)(lVar1 + 0x2c + lVar8)));
        d3d::unlockVertices(*(void **)(lVar1 + 0x20 + lVar8));
      }
    }
    (*DAT_00144da0)(puVar4);
  }
  return stream;
}

Assistant:

Stream*
writeNativeData(Stream *stream, int32 len, void *object, int32, int32)
{
	ASSERTLITTLE;
	Geometry *geometry = (Geometry*)object;
	writeChunkHeader(stream, ID_STRUCT, len-12);
	if(geometry->instData == nil ||
	   geometry->instData->platform != PLATFORM_D3D9)
		return stream;
	stream->writeU32(PLATFORM_D3D9);
	InstanceDataHeader *header = (InstanceDataHeader*)geometry->instData;
	int32 size = 64 + geometry->meshHeader->numMeshes*36;
	uint8 *data = rwNewT(uint8, size, MEMDUR_FUNCTION | ID_GEOMETRY);
	stream->writeI32(size);

	uint8 *p = data;
	*(uint32*)p = header->serialNumber; p += 4;
	*(uint32*)p = header->numMeshes; p += 4;
	p += 4;		// skip index buffer
	*(uint32*)p = header->primType; p += 4;
	p += 16*2;	// skip vertex streams, they're repeated with the vertex buffers
	*(bool32*)p = header->useOffsets; p += 4;
	p += 4;		// skip vertex declaration
	*(uint32*)p = header->totalNumIndex; p += 4;
	*(uint32*)p = header->totalNumVertex; p += 4;

	InstanceData *inst = header->inst;
	for(uint32 i = 0; i < header->numMeshes; i++){
		*(uint32*)p = inst->numIndex; p += 4;
		*(uint32*)p = inst->minVert; p += 4;
		int32 matid = geometry->matList.findIndex(inst->material);
		*(int32*)p = matid; p += 4;
		*(bool32*)p = inst->vertexAlpha; p += 4;
		*(uint32*)p = 0; p += 4;		// vertex shader
		*(uint32*)p = inst->baseIndex; p += 4;	// not used but meh...
		*(uint32*)p = inst->numVertices; p += 4;
		*(uint32*)p = inst->startIndex; p += 4;
		*(uint32*)p = inst->numPrimitives; p += 4;
		inst++;
	}
	stream->write8(data, size);

	VertexElement elements[NUMDECLELT];
	uint32 numElt = getDeclaration(header->vertexDeclaration, elements);
	stream->writeU32(numElt);
	stream->write8(elements, 8*numElt);

	uint16 *indices = lockIndices(header->indexBuffer, 0, 0, 0);
	stream->write8(indices, 2*header->totalNumIndex);
	unlockIndices(header->indexBuffer);

	VertexStream *s;
	for(int i = 0; i < 2; i++){
		s = &header->vertexStream[i];
		p = data;
		*(uint32*)p = s->vertexBuffer ? 0xbadeaffe : 0; p += 4;
		*(uint32*)p = s->offset; p += 4;
		*(uint32*)p = s->stride; p += 4;
		*(uint16*)p = s->geometryFlags; p += 2;
		*p++ = s->managed;
		*p++ = s->dynamicLock;
		stream->write8(data, 16);

		if(s->vertexBuffer == nil)
			continue;
		uint8 *verts = lockVertices(s->vertexBuffer, 0, 0, D3DLOCK_NOSYSLOCK);
		stream->write8(verts, s->stride*header->totalNumVertex);
		unlockVertices(s->vertexBuffer);
	}

	rwFree(data);
	return stream;
}